

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_resolver.cpp
# Opt level: O0

void __thiscall
cpptrace::detail::libdwarf::dwarf_resolver::resolve_frame_core
          (dwarf_resolver *this,object_frame *object_frame_info,stacktrace_frame *frame,
          vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_> *inlines)

{
  undefined8 cu_die_00;
  undefined8 pc_00;
  bool bVar1;
  Dwarf_Half DVar2;
  cu_info *pcVar3;
  undefined1 local_a8 [8];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
  dwo_name;
  die_object *cu_die;
  undefined1 local_68 [8];
  optional<cpptrace::detail::libdwarf::dwarf_resolver::cu_info,_0> cu;
  frame_ptr pc;
  vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_> *inlines_local;
  stacktrace_frame *frame_local;
  object_frame *object_frame_info_local;
  dwarf_resolver *this_local;
  
  cu._48_8_ = object_frame_info->object_address;
  lookup_cu((optional<cpptrace::detail::libdwarf::dwarf_resolver::cu_info,_0> *)local_68,this,
            cu._48_8_);
  bVar1 = detail::optional::operator_cast_to_bool((optional *)local_68);
  if (bVar1) {
    pcVar3 = optional<cpptrace::detail::libdwarf::dwarf_resolver::cu_info,_0>::unwrap
                       ((optional<cpptrace::detail::libdwarf::dwarf_resolver::cu_info,_0> *)local_68
                       );
    dwo_name._32_8_ = maybe_owned_die_object::get(&pcVar3->cu_die);
    get_dwo_name_abi_cxx11_
              ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                *)local_a8,this,(die_object *)dwo_name._32_8_);
    DVar2 = die_object::get_tag((die_object *)dwo_name._32_8_);
    if ((DVar2 == 0x4a) ||
       ((bVar1 = detail::optional::operator_cast_to_bool((optional *)local_a8), bVar1 &&
        (bVar1 = detail::optional::operator_cast_to_bool((optional *)&this->skeleton), !bVar1)))) {
      perform_dwarf_fission_resolution
                (this,(die_object *)dwo_name._32_8_,
                 (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  *)local_a8,object_frame_info,frame,inlines);
    }
    else {
      retrieve_line_info(this,(die_object *)dwo_name._32_8_,cu._48_8_,frame);
      pc_00 = cu._48_8_;
      cu_die_00 = dwo_name._32_8_;
      pcVar3 = optional<cpptrace::detail::libdwarf::dwarf_resolver::cu_info,_0>::unwrap
                         ((optional<cpptrace::detail::libdwarf::dwarf_resolver::cu_info,_0> *)
                          local_68);
      retrieve_symbol(this,(die_object *)cu_die_00,pc_00,pcVar3->dwversion,frame,inlines);
    }
    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>::
    ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
               *)local_a8);
  }
  optional<cpptrace::detail::libdwarf::dwarf_resolver::cu_info,_0>::~optional
            ((optional<cpptrace::detail::libdwarf::dwarf_resolver::cu_info,_0> *)local_68);
  return;
}

Assistant:

CPPTRACE_FORCE_NO_INLINE_FOR_PROFILING
        void resolve_frame_core(
            const object_frame& object_frame_info,
            stacktrace_frame& frame,
            std::vector<stacktrace_frame>& inlines
        ) {
            auto pc = object_frame_info.object_address;
            if(dump_dwarf) {
                std::fprintf(stderr, "%s\n", object_path.c_str());
                std::fprintf(stderr, "%llx\n", to_ull(pc));
            }
            optional<cu_info> cu = lookup_cu(pc);
            if(cu) {
                const auto& cu_die = cu.unwrap().cu_die.get();
                // gnu non-standard debug-fission may create non-skeleton CU DIEs and just add dwo attributes
                // clang emits dwo names in the split CUs, so guard against going down the dwarf fission path (which
                // doesn't infinitely recurse because it's not emitted as an absolute path and there's no comp dir but
                // it's good to guard against the infinite recursion anyway)
                auto dwo_name = get_dwo_name(cu_die);
                if(cu_die.get_tag() == DW_TAG_skeleton_unit || (dwo_name && !skeleton)) {
                    perform_dwarf_fission_resolution(cu_die, dwo_name, object_frame_info, frame, inlines);
                } else {
                    retrieve_line_info(cu_die, pc, frame);
                    retrieve_symbol(cu_die, pc, cu.unwrap().dwversion, frame, inlines);
                }
            }
        }